

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

int av1_get_adaptive_rdmult(AV1_COMP *cpi,double beta)

{
  aom_enc_pass aVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  int layer_depth;
  int iVar4;
  uint is_stat_consumption_stage;
  
  pAVar2 = cpi->ppi;
  iVar3 = (pAVar2->p_rc).gfu_boost;
  iVar4 = (pAVar2->gf_group).layer_depth[cpi->gf_frame_index];
  aVar1 = (cpi->oxcf).pass;
  is_stat_consumption_stage = 1;
  if (((aVar1 < AOM_RC_LAST_PASS) && (is_stat_consumption_stage = 0, aVar1 == AOM_RC_ONE_PASS)) &&
     (cpi->compressor_stage == '\0')) {
    is_stat_consumption_stage = (uint)(pAVar2->lap_enabled != 0);
  }
  layer_depth = 6;
  if (iVar4 < 6) {
    layer_depth = iVar4;
  }
  iVar4 = 0xf;
  if (iVar3 < 0x640) {
    iVar4 = iVar3 / 100;
  }
  iVar3 = av1_compute_rd_mult((cpi->common).quant_params.base_qindex,
                              ((cpi->common).seq_params)->bit_depth,
                              (pAVar2->gf_group).update_type[cpi->gf_frame_index],layer_depth,iVar4,
                              (cpi->common).current_frame.frame_type,
                              (cpi->oxcf).q_cfg.use_fixed_qp_offsets,is_stat_consumption_stage,
                              (cpi->oxcf).tune_cfg.tuning);
  return (int)((double)iVar3 / beta);
}

Assistant:

int av1_get_adaptive_rdmult(const AV1_COMP *cpi, double beta) {
  assert(beta > 0.0);
  const AV1_COMMON *cm = &cpi->common;

  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  const int qindex_rdmult = cm->quant_params.base_qindex;
  return (int)(av1_compute_rd_mult(
                   qindex_rdmult, cm->seq_params->bit_depth,
                   cpi->ppi->gf_group.update_type[cpi->gf_frame_index],
                   layer_depth, boost_index, frame_type,
                   cpi->oxcf.q_cfg.use_fixed_qp_offsets,
                   is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning) /
               beta);
}